

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

int __thiscall
QHttpSocketEngine::accept(QHttpSocketEngine *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffff88;
  QString *errorString;
  SocketError error;
  QMessageLogger *in_stack_ffffffffffffffa0;
  QString *this_00;
  QLatin1StringView in_stack_ffffffffffffffc0;
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  errorString = &local_28;
  QMessageLogger::QMessageLogger
            (in_stack_ffffffffffffffa0,(char *)this,(int)((ulong)errorString >> 0x20),
             (char *)(ulong)in_stack_ffffffffffffff88);
  QMessageLogger::warning((char *)errorString,"Operation is not supported");
  Qt::Literals::StringLiterals::operator____L1((char *)this,(size_t)errorString);
  error = (SocketError)((ulong)this >> 0x20);
  this_00 = (QString *)&stack0xffffffffffffffc0;
  QString::QString(this_00,in_stack_ffffffffffffffc0);
  QAbstractSocketEngine::setError((QAbstractSocketEngine *)this_00,error,errorString);
  QString::~QString((QString *)0x339946);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return -1;
  }
  __stack_chk_fail();
}

Assistant:

qintptr QHttpSocketEngine::accept()
{
    qWarning("Operation is not supported");
    setError(QAbstractSocket::UnsupportedSocketOperationError, "Unsupported socket operation"_L1);
    return -1;
}